

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O1

void __thiscall
chrono::turtlebot::Turtlebot_PassiveWheel::Turtlebot_PassiveWheel
          (Turtlebot_PassiveWheel *this,string *name,bool fixed,
          shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system,ChVector<double> *body_pos,
          ChQuaternion<double> *body_rot,shared_ptr<chrono::ChBodyAuxRef> chassis,bool collide)

{
  shared_ptr<chrono::ChBodyAuxRef> local_30;
  shared_ptr<chrono::ChMaterialSurface> local_20;
  
  local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        (chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8);
  if (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Turtlebot_Part::Turtlebot_Part
            (&this->super_Turtlebot_Part,name,fixed,&local_20,system,body_pos,body_rot,&local_30,
             chassis.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._0_1_);
  if (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Turtlebot_Part)._vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_0017f450;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Turtlebot_Part).m_mesh_name,0,
             (char *)(this->super_Turtlebot_Part).m_mesh_name._M_string_length,0x16da5e);
  (this->super_Turtlebot_Part).m_offset.m_data[0] = 0.0;
  (this->super_Turtlebot_Part).m_offset.m_data[1] = 0.0;
  (this->super_Turtlebot_Part).m_offset.m_data[2] = 0.0;
  (this->super_Turtlebot_Part).m_color.R = 0.4;
  (this->super_Turtlebot_Part).m_color.G = 0.4;
  (this->super_Turtlebot_Part).m_color.B = 0.7;
  (this->super_Turtlebot_Part).m_density = 200.0;
  return;
}

Assistant:

Turtlebot_PassiveWheel::Turtlebot_PassiveWheel(const std::string& name,
                                               bool fixed,
                                               std::shared_ptr<ChMaterialSurface> mat,
                                               ChSystem* system,
                                               const ChVector<>& body_pos,
                                               const ChQuaternion<>& body_rot,
                                               std::shared_ptr<ChBodyAuxRef> chassis,
                                               bool collide)
    : Turtlebot_Part(name, fixed, mat, system, body_pos, body_rot, chassis, collide) {
    m_mesh_name = "passive_wheel";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
    m_density = 200;
}